

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::crn_unpacker::unpack_dxt1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  byte bVar2;
  uint32 uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint new_size;
  uint32 y;
  uint uVar9;
  uint uVar10;
  block_buffer_element *pbVar11;
  uint uVar12;
  bool bVar13;
  uint8 *local_98;
  
  uVar1 = (this->m_color_endpoints).m_size;
  new_size = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if ((this->m_block_buffer).m_size < new_size) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(this_01,new_size);
  }
  this_00 = &this->m_codec;
  uVar5 = 0;
  uVar7 = 0;
  uVar10 = 0;
  do {
    if ((this->m_pHeader->m_faces).m_buf[0] <= uVar5) {
      return true;
    }
    local_98 = pDst[uVar5];
    for (uVar9 = 0; uVar9 != (output_height + 1 & 0xfffffffe); uVar9 = uVar9 + 1) {
      bVar13 = uVar9 < output_height;
      uVar12 = 0;
      uVar4 = 0;
      for (lVar8 = 0; uVar6 = (uint)uVar7, (ulong)(output_width + 1 & 0xfffffffe) << 3 != lVar8;
          lVar8 = lVar8 + 8) {
        if (((uVar9 | uVar12) & 1) == 0) {
          uVar3 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
          uVar7 = (ulong)uVar3;
          pbVar11 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar8);
LAB_00112a50:
          bVar2 = (byte)uVar7 & 3;
          pbVar11->endpoint_reference = (ushort)((byte)(uVar7 >> 2) & 3);
          uVar6 = (uint)(uVar7 >> 4) & 0xf;
        }
        else {
          if ((uVar9 & 1) == 0) {
            pbVar11 = this_01->m_p + uVar4;
            goto LAB_00112a50;
          }
          pbVar11 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar8);
          bVar2 = (byte)pbVar11->endpoint_reference;
        }
        uVar7 = (ulong)uVar6;
        if (bVar2 == 1) {
          pbVar11->color_endpoint_index = (uint16)uVar10;
        }
        else if (bVar2 == 0) {
          uVar3 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm);
          uVar6 = 0;
          if (uVar1 <= uVar3 + uVar10) {
            uVar6 = uVar1;
          }
          uVar10 = (uVar3 + uVar10) - uVar6;
          pbVar11->color_endpoint_index = (uint16)uVar10;
        }
        else {
          uVar10 = (uint)pbVar11->color_endpoint_index;
        }
        bVar13 = (bool)(bVar13 & uVar4 < output_width);
        uVar3 = symbol_codec::decode(this_00,this->m_selector_delta_dm);
        if (bVar13) {
          *(uint *)(local_98 + lVar8) = (this->m_color_endpoints).m_p[uVar10];
          *(uint *)(local_98 + lVar8 + 4) = (this->m_color_selectors).m_p[uVar3];
        }
        uVar4 = uVar4 + 1;
        uVar12 = uVar12 + 1;
      }
      local_98 = local_98 + lVar8 + (long)(int)((output_pitch_in_bytes >> 2) + new_size * -2) * 4;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool unpack_dxt1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_color_endpoints = m_color_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 color_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
            buffer.color_endpoint_index = color_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.color_endpoint_index = color_endpoint_index;
          } else {
            color_endpoint_index = buffer.color_endpoint_index;
          }
          uint32 color_selector_index = m_codec.decode(m_selector_delta_dm[0]);
          if (visible) {
            pData[0] = m_color_endpoints[color_endpoint_index];
            pData[1] = m_color_selectors[color_selector_index];
          }
        }
      }
    }
    return true;
  }